

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O2

void JsrtDebugUtils::AddFileNameOrScriptTypeToObject
               (DynamicObject *object,Utf8SourceInfo *utf8SourceInfo)

{
  Type pcVar1;
  code *pcVar2;
  bool bVar3;
  SourceContextInfo *pSVar4;
  undefined4 *puVar5;
  FunctionBody *this;
  char16 *string;
  size_t len;
  ScriptContext *scriptContext;
  JsrtDebugPropertyId JStack_30;
  
  bVar3 = Js::Utf8SourceInfo::IsDynamic(utf8SourceInfo);
  pSVar4 = Js::Utf8SourceInfo::GetSourceContextInfo(utf8SourceInfo);
  pcVar1 = (pSVar4->field_5).field_0.url;
  if (bVar3) {
    if (pcVar1 != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugUtils.cpp"
                         ,0x1c,"(utf8SourceInfo->GetSourceContextInfo()->url == nullptr)",
                         "How come dynamic code have a url?");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    this = Js::Utf8SourceInfo::GetAnyParsedFunction(utf8SourceInfo);
    if (this == (FunctionBody *)0x0) {
      string = L"Unknown script code";
    }
    else {
      string = Js::ParseableFunctionInfo::GetSourceName(&this->super_ParseableFunctionInfo);
    }
    len = PAL_wcslen(string);
    scriptContext = (utf8SourceInfo->m_scriptContext).ptr;
    JStack_30._value = 0x1b;
  }
  else {
    if (pcVar1 == (Type)0x0) {
      string = L"";
    }
    else {
      pSVar4 = Js::Utf8SourceInfo::GetSourceContextInfo(utf8SourceInfo);
      string = (pSVar4->field_5).field_0.url;
    }
    len = PAL_wcslen(string);
    scriptContext = (utf8SourceInfo->m_scriptContext).ptr;
    JStack_30._value = 8;
  }
  AddPropertyToObject(object,JStack_30,string,len,scriptContext);
  return;
}

Assistant:

void JsrtDebugUtils::AddFileNameOrScriptTypeToObject(Js::DynamicObject* object, Js::Utf8SourceInfo* utf8SourceInfo)
{
    if (utf8SourceInfo->IsDynamic())
    {
        AssertMsg(utf8SourceInfo->GetSourceContextInfo()->url == nullptr, "How come dynamic code have a url?");

        Js::FunctionBody* anyFunctionBody = utf8SourceInfo->GetAnyParsedFunction();

        LPCWSTR sourceName = (anyFunctionBody != nullptr) ? anyFunctionBody->GetSourceName() : Js::Constants::UnknownScriptCode;

        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::scriptType, sourceName, wcslen(sourceName), utf8SourceInfo->GetScriptContext());
    }
    else
    {
        // url can be nullptr if JsParseScript/JsRunScript didn't passed any
        const char16* url = utf8SourceInfo->GetSourceContextInfo()->url == nullptr ? _u("") : utf8SourceInfo->GetSourceContextInfo()->url;
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::fileName, url, wcslen(url), utf8SourceInfo->GetScriptContext());
    }
}